

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::Subtract(VirtualMachine *this)

{
  bool bVar1;
  VariableType VVar2;
  anon_union_8_6_52c89740_for_Variable_1 aVar3;
  Variable VVar4;
  Variable VVar5;
  Variable v2;
  Variable first;
  Variable second;
  VirtualMachine *this_local;
  
  VVar4 = popOpStack(this);
  aVar3 = VVar4.field_1;
  VVar5 = popOpStack(this);
  VVar2 = VVar5.type;
  VVar5._4_4_ = 0;
  VVar5.type = VVar2;
  v2._4_4_ = 0;
  v2.type = VVar4.type;
  v2.field_1.integerValue = aVar3.integerValue;
  bVar1 = protectDifferentTypes(this,VVar5,v2);
  if (bVar1) {
    if (VVar2 == Integer) {
      pushInteger(this,(long)VVar5.field_1.objectValue - (long)aVar3);
    }
    else if (VVar2 == Float) {
      pushFloat(this,VVar5.field_1.doubleValue - aVar3.doubleValue);
    }
    else {
      pushUndefined(this);
    }
    advance(this);
  }
  else {
    advance(this);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::Subtract() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (!this->protectDifferentTypes(first, second)) {
    this->advance();
    return;
  }

  if (first.type == VariableType::Integer) {
    this->pushInteger(first.integerValue - second.integerValue);

  } else if (first.type == VariableType::Float) {
    this->pushFloat(first.doubleValue - second.doubleValue);

  } else {
    this->pushUndefined();
  }

  this->advance();
}